

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

timestamp_t __thiscall
duckdb::QuantileSortTree::WindowScalar<duckdb::timestamp_t,duckdb::timestamp_t,false>
          (QuantileSortTree *this,QuantileCursor<duckdb::timestamp_t> *data,SubFrames *frames,
          idx_t n,Vector *result,QuantileValue *q)

{
  long lVar1;
  WindowMergeSortTree *this_00;
  pointer pWVar2;
  unsigned_long hidx;
  timestamp_t tVar3;
  ulong n_00;
  ulong n_01;
  double dVar4;
  undefined1 auVar5 [16];
  pair<unsigned_long,_unsigned_long> pVar6;
  pair<unsigned_long,_unsigned_long> pVar7;
  Interpolator<false> interp;
  ID indirect;
  Interpolator<false> local_78;
  double local_48;
  double dStack_40;
  QuantileIndirect<duckdb::timestamp_t> local_38;
  
  this_00 = &unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
             ::operator->(&this->index_tree)->super_WindowMergeSortTree;
  WindowMergeSortTree::Build(this_00);
  local_78.desc = false;
  lVar1 = n - 1;
  auVar5._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar5._0_8_ = lVar1;
  auVar5._12_4_ = 0x45300000;
  dStack_40 = auVar5._8_8_ - 1.9342813113834067e+25;
  local_78.RN = (dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) *
                q->dbl;
  local_48 = local_78.RN;
  dVar4 = floor(local_78.RN);
  n_01 = (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4;
  local_78.FRN = n_01;
  dVar4 = ceil(local_48);
  n_00 = (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4;
  local_78.begin = 0;
  local_78.CRN = n_00;
  local_78.end = n;
  pWVar2 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>::
           operator->(&this->index_tree);
  pVar6 = WindowIndexTree::SelectNth(pWVar2,frames,n_01);
  hidx = pVar6.first;
  if (n_00 != n_01) {
    pWVar2 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
             ::operator->(&this->index_tree);
    pVar7 = WindowIndexTree::SelectNth(pWVar2,frames,n_00);
    hidx = pVar7.first;
  }
  local_38.data = data;
  tVar3 = Interpolator<false>::
          Interpolate<unsigned_long,duckdb::timestamp_t,duckdb::QuantileIndirect<duckdb::timestamp_t>>
                    (&local_78,pVar6.first,hidx,result,&local_38);
  return (timestamp_t)tVar3.value;
}

Assistant:

RESULT_TYPE WindowScalar(QuantileCursor<INPUT_TYPE> &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) {
		D_ASSERT(n > 0);

		//	Thread safe and idempotent.
		index_tree->Build();

		//	Find the interpolated indicies within the frame
		Interpolator<DISCRETE> interp(q, n, false);
		const auto lo_data = SelectNth(frames, interp.FRN);
		auto hi_data = lo_data;
		if (interp.CRN != interp.FRN) {
			hi_data = SelectNth(frames, interp.CRN);
		}

		//	Interpolate indirectly
		using ID = QuantileIndirect<INPUT_TYPE>;
		ID indirect(data);
		return interp.template Interpolate<idx_t, RESULT_TYPE, ID>(lo_data, hi_data, result, indirect);
	}